

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O1

InterruptResult * __thiscall
node::KernelNotifications::blockTip
          (InterruptResult *__return_storage_ptr__,KernelNotifications *this,
          SynchronizationState state,CBlockIndex *index)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  undefined4 in_register_00000014;
  InterruptResult *pIVar3;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CClientUIInterface::NotifyBlockTip
            ((CClientUIInterface *)&uiInterface,(SynchronizationState)this,
             (CBlockIndex *)CONCAT44(in_register_00000014,state));
  pIVar3 = (InterruptResult *)0x0;
  if ((*(int *)(__return_storage_ptr__ + 4) != 0) &&
     (*(int *)(__return_storage_ptr__ + 4) <=
      ((CBlockIndex *)CONCAT44(in_register_00000014,state))->nHeight)) {
    bVar1 = util::SignalInterrupt::operator()(*(SignalInterrupt **)(__return_storage_ptr__ + 8));
    pIVar3 = (InterruptResult *)0x100;
    if (!bVar1) {
      pLVar2 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar2);
      if (bVar1) {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        tinyformat::format<>
                  (&local_70,"Failed to send shutdown signal after reaching stop height\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pLVar2 = LogInstance();
        local_70._M_dataplus._M_p = (pointer)0x66;
        local_70._M_string_length = 0xfe3620;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/kernel_notifications.cpp"
        ;
        source_file._M_len = 0x66;
        str._M_str = local_50._M_dataplus._M_p;
        str._M_len = local_50._M_string_length;
        logging_function._M_str = "blockTip";
        logging_function._M_len = 8;
        BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x38,ALL,Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pIVar3;
  }
  __stack_chk_fail();
}

Assistant:

kernel::InterruptResult KernelNotifications::blockTip(SynchronizationState state, CBlockIndex& index)
{
    uiInterface.NotifyBlockTip(state, &index);
    if (m_stop_at_height && index.nHeight >= m_stop_at_height) {
        if (!m_shutdown()) {
            LogError("Failed to send shutdown signal after reaching stop height\n");
        }
        return kernel::Interrupted{};
    }
    return {};
}